

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O2

ValidSchema makeValidSchema(char *schema)

{
  shared_count extraout_RDX;
  char *in_RSI;
  ValidSchema VVar1;
  allocator<char> local_1a9;
  ValidSchema vs;
  istringstream iss;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&vs,in_RSI,&local_1a9);
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&vs,_S_in);
  std::__cxx11::string::~string((string *)&vs);
  avro::ValidSchema::ValidSchema(&vs);
  avro::compileJsonSchema((istream *)&iss,&vs);
  *(element_type **)schema = vs.root_.px;
  *(sp_counted_base **)(schema + 8) = vs.root_.pn.pi_;
  if (vs.root_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (vs.root_.pn.pi_)->use_count_ = (vs.root_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  boost::detail::shared_count::~shared_count(&vs.root_.pn);
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  VVar1.root_.pn.pi_ = extraout_RDX.pi_;
  VVar1.root_.px = (element_type *)schema;
  return (ValidSchema)VVar1.root_;
}

Assistant:

static ValidSchema makeValidSchema(const char* schema)
{
    istringstream iss(schema);
    ValidSchema vs;
    compileJsonSchema(iss, vs);
    return ValidSchema(vs);
}